

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O0

void __thiscall cmOrderDirectories::FindImplicitConflicts(cmOrderDirectories *this)

{
  bool bVar1;
  reference this_00;
  pointer this_01;
  ulong uVar2;
  cmake *this_02;
  string *args_1;
  undefined1 local_210 [16];
  string local_200;
  bool local_1dc;
  undefined3 uStack_1db;
  undefined1 local_1d8 [8];
  string text;
  unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>
  *entry;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>,_std::allocator<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>_>_>
  *__range1;
  ostringstream conflicts;
  cmOrderDirectories *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range1);
  __end1 = std::
           vector<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>,_std::allocator<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>_>_>
           ::begin(&this->ImplicitDirEntries);
  entry = (unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>
           *)std::
             vector<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>,_std::allocator<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>_>_>
             ::end(&this->ImplicitDirEntries);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>_*,_std::vector<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>,_std::allocator<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>_>_>_>
                                     *)&entry), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>_*,_std::vector<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>,_std::allocator<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>_>_>_>
              ::operator*(&__end1);
    this_01 = std::
              unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>
              ::operator->(this_00);
    cmOrderDirectoriesConstraint::FindImplicitConflicts(this_01,(ostringstream *)&__range1);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>_*,_std::vector<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>,_std::allocator<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::ostringstream::str();
  uVar2 = std::__cxx11::string::empty();
  local_1dc = (uVar2 & 1) != 0;
  if (!local_1dc) {
    this_02 = cmGlobalGenerator::GetCMakeInstance(this->GlobalGenerator);
    args_1 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    cmStrCat<char_const(&)[24],std::__cxx11::string&,char_const(&)[13],std::__cxx11::string_const&,char_const(&)[90],std::__cxx11::string_const&,char_const(&)[52]>
              ((string *)(local_210 + 0x10),(char (*) [24])"Cannot generate a safe ",&this->Purpose,
               (char (*) [13])0x107a1c3,args_1,
               (char (*) [90])
               " because files in some directories may conflict with  libraries in implicit directories:\n"
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
               (char (*) [52])"Some of these libraries may not be found correctly.");
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_210);
    cmake::IssueMessage(this_02,WARNING,(string *)(local_210 + 0x10),
                        (cmListFileBacktrace *)local_210);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_210);
    std::__cxx11::string::~string((string *)(local_210 + 0x10));
  }
  uStack_1db = 0;
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range1);
  return;
}

Assistant:

void cmOrderDirectories::FindImplicitConflicts()
{
  // Check for items in implicit link directories that have conflicts
  // in the explicit directories.
  std::ostringstream conflicts;
  for (const auto& entry : this->ImplicitDirEntries) {
    entry->FindImplicitConflicts(conflicts);
  }

  // Skip warning if there were no conflicts.
  std::string const text = conflicts.str();
  if (text.empty()) {
    return;
  }

  // Warn about the conflicts.
  this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
    MessageType::WARNING,
    cmStrCat("Cannot generate a safe ", this->Purpose, " for target ",
             this->Target->GetName(),
             " because files in some directories may "
             "conflict with  libraries in implicit directories:\n",
             text, "Some of these libraries may not be found correctly."),
    this->Target->GetBacktrace());
}